

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::GetFrameworkDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool rootDir)

{
  string local_78;
  string local_48;
  undefined1 local_22;
  byte local_21;
  string *psStack_20;
  bool rootDir_local;
  string *config_local;
  cmTarget *this_local;
  string *fpath;
  
  local_22 = 0;
  local_21 = rootDir;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetOutputName(&local_48,this,psStack_20,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".framework");
  if ((local_21 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Versions/");
    GetFrameworkVersion_abi_cxx11_(&local_78,this);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetFrameworkDirectory(const std::string& config,
                                            bool rootDir) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".framework";
  if(!rootDir)
    {
    fpath += "/Versions/";
    fpath += this->GetFrameworkVersion();
    }
  return fpath;
}